

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c352.c
# Opt level: O0

void device_reset_c352(void *chip)

{
  UINT32 MuteMask;
  UINT32 muteMask;
  C352 *c;
  void *chip_local;
  
  MuteMask = c352_get_mute_mask(chip);
  memset((void *)((long)chip + 0xc),0,0x480);
  *(undefined2 *)((long)chip + 0x48c) = 0x1234;
  *(undefined2 *)((long)chip + 0x48e) = 0;
  c352_set_mute_mask(chip,MuteMask);
  return;
}

Assistant:

static void device_reset_c352(void *chip)
{
	C352 *c = (C352 *)chip;
	UINT32 muteMask;
	
	muteMask = c352_get_mute_mask(c);
	
	// clear all channels states
	memset(c->v,0,sizeof(C352_Voice)*C352_VOICES);
	
	// init noise generator
	c->random = 0x1234;
	c->control = 0;
	
	c352_set_mute_mask(c, muteMask);
	
	return;
}